

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

VarStatus __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::basisColStatus(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int col)

{
  double dVar1;
  VarStatus VVar2;
  int iVar3;
  uint uVar4;
  cpp_dec_float<100U,_int,_void> cStack_b8;
  cpp_dec_float<100U,_int,_void> local_68;
  
  VVar2 = ZERO;
  if (-1 < col) {
    if (col < (this->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
      if (this->_hasBasis == false) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lowerUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&cStack_b8,this->_realLP,col);
        if ((cStack_b8.fpclass != cpp_dec_float_NaN) &&
           (dVar1 = this->_currentSettings->_realParamValues[6], !NAN(dVar1))) {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 0x10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems[6] = 0;
          local_68.data._M_elems[7] = 0;
          local_68.data._M_elems[8] = 0;
          local_68.data._M_elems[9] = 0;
          local_68.data._M_elems[10] = 0;
          local_68.data._M_elems[0xb] = 0;
          local_68.data._M_elems[0xc] = 0;
          local_68.data._M_elems[0xd] = 0;
          local_68.data._M_elems._56_5_ = 0;
          local_68.data._M_elems[0xf]._1_3_ = 0;
          local_68.exp = 0;
          local_68.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_68,-dVar1);
          iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&cStack_b8,&local_68);
          if (0 < iVar3) {
            return ON_LOWER;
          }
        }
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upperUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&cStack_b8,this->_realLP,col);
        if ((cStack_b8.fpclass == cpp_dec_float_NaN) ||
           (dVar1 = this->_currentSettings->_realParamValues[6], NAN(dVar1))) {
          VVar2 = ZERO;
        }
        else {
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 0x10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems[6] = 0;
          local_68.data._M_elems[7] = 0;
          local_68.data._M_elems[8] = 0;
          local_68.data._M_elems[9] = 0;
          local_68.data._M_elems[10] = 0;
          local_68.data._M_elems[0xb] = 0;
          local_68.data._M_elems[0xc] = 0;
          local_68.data._M_elems[0xd] = 0;
          local_68.data._M_elems._56_5_ = 0;
          local_68.data._M_elems[0xf]._1_3_ = 0;
          local_68.exp = 0;
          local_68.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_68,dVar1);
          uVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&cStack_b8,&local_68);
          VVar2 = ((int)~uVar4 >> 0x1f) * -3;
        }
      }
      else {
        if (this->_isRealLPLoaded == true) {
          VVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::basisStatusToVarStatus
                            (&this->_solver,
                             (this->_solver).
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .thedesc.colstat.data[(uint)col]);
          return VVar2;
        }
        VVar2 = (this->_basisStatusCols).data[(uint)col];
      }
    }
  }
  return VVar2;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisColStatus(int col) const
{
   assert(col >= 0);
   assert(col < numCols());

   // if index is out of range, return nonbasic status as for a newly added unbounded column
   if(col < 0 || col >= numCols())
   {
      return SPxSolverBase<R>::ZERO;
   }
   // if no basis is available, return slack basis
   else if(!hasBasis())
   {
      if(lowerReal(col) > -realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_LOWER;
      else if(upperReal(col) < realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_UPPER;
      else
         return SPxSolverBase<R>::ZERO;
   }
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisColStatus(col);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(col < _basisStatusCols.size());
      return _basisStatusCols[col];
   }
}